

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlParserFinishElementParsing(htmlParserCtxtPtr ctxt)

{
  int iVar1;
  _xmlNode *p_Var2;
  xmlParserInputPtr pxVar3;
  xmlParserNodeInfoPtr info;
  xmlParserNodeInfo *pxVar4;
  
  p_Var2 = ctxt->node;
  if ((p_Var2 != (_xmlNode *)0x0) && (ctxt->record_info != 0)) {
    pxVar3 = ctxt->input;
    info = ctxt->nodeInfo;
    info->end_pos = (unsigned_long)(pxVar3->cur + (pxVar3->consumed - (long)pxVar3->base));
    info->end_line = (long)pxVar3->line;
    info->node = p_Var2;
    xmlParserAddNodeInfo(ctxt,info);
    iVar1 = ctxt->nodeInfoNr;
    if (0 < (long)iVar1) {
      ctxt->nodeInfoNr = iVar1 + -1;
      if (iVar1 == 1) {
        pxVar4 = (xmlParserNodeInfo *)0x0;
      }
      else {
        pxVar4 = ctxt->nodeInfoTab + (long)iVar1 + -2;
      }
      ctxt->nodeInfo = pxVar4;
    }
  }
  if (*ctxt->input->cur != '\0') {
    return;
  }
  htmlAutoCloseOnEnd(ctxt);
  return;
}

Assistant:

static void
htmlParserFinishElementParsing(htmlParserCtxtPtr ctxt) {
    /*
     * Capture end position and add node
     */
    if ( ctxt->node != NULL && ctxt->record_info ) {
       ctxt->nodeInfo->end_pos = ctxt->input->consumed +
                                (CUR_PTR - ctxt->input->base);
       ctxt->nodeInfo->end_line = ctxt->input->line;
       ctxt->nodeInfo->node = ctxt->node;
       xmlParserAddNodeInfo(ctxt, ctxt->nodeInfo);
       htmlNodeInfoPop(ctxt);
    }
    if (CUR == 0) {
       htmlAutoCloseOnEnd(ctxt);
    }
}